

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_type_createAnonymousClassAndMetaclass(sysbvm_context_t *context,sysbvm_tuple_t supertype)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_metaclass_t *metaclassObject;
  sysbvm_tuple_t class;
  sysbvm_tuple_t metaclass;
  sysbvm_tuple_t actualSuperType;
  sysbvm_tuple_t metaclassSupertype;
  sysbvm_tuple_t supertype_local;
  sysbvm_context_t *context_local;
  
  actualSuperType = (context->roots).classType;
  metaclass = supertype;
  if (supertype == 0) {
    metaclass = (context->roots).objectType;
  }
  _Var1 = sysbvm_tuple_isKindOf(context,metaclass,(context->roots).classType);
  if (_Var1) {
    actualSuperType = sysbvm_tuple_getType(context,metaclass);
  }
  else {
    _Var1 = sysbvm_type_isDirectSubtypeOf(metaclass,(context->roots).typeType);
    if (_Var1) {
      sVar2 = sysbvm_type_getSupertype(metaclass);
      actualSuperType = sysbvm_tuple_getType(context,sVar2);
    }
  }
  sVar2 = sysbvm_type_createAnonymousMetaclass(context,actualSuperType);
  sVar3 = sysbvm_type_createAnonymousClass(context,metaclass,sVar2);
  *(sysbvm_tuple_t *)(sVar2 + 0xf8) = sVar3;
  return sVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymousClassAndMetaclass(sysbvm_context_t *context, sysbvm_tuple_t supertype)
{
    sysbvm_tuple_t metaclassSupertype = context->roots.classType;
    sysbvm_tuple_t actualSuperType = supertype;
    if(!supertype)
        actualSuperType = context->roots.objectType;

    if(sysbvm_tuple_isKindOf(context, actualSuperType, context->roots.classType))
        metaclassSupertype = sysbvm_tuple_getType(context, actualSuperType);
    else if(sysbvm_type_isDirectSubtypeOf(actualSuperType, context->roots.typeType))
        metaclassSupertype = sysbvm_tuple_getType(context, sysbvm_type_getSupertype(actualSuperType));

    sysbvm_tuple_t metaclass = sysbvm_type_createAnonymousMetaclass(context, metaclassSupertype);
    sysbvm_tuple_t class = sysbvm_type_createAnonymousClass(context, actualSuperType, metaclass);

    // Link together the class with its metaclass.
    sysbvm_metaclass_t *metaclassObject = (sysbvm_metaclass_t*)metaclass;
    metaclassObject->super.thisType = class;
    return class;
}